

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

void __thiscall QHexView::paint(QHexView *this,QPainter *painter)

{
  int iVar1;
  QRectF local_60;
  QTextCursor local_40 [8];
  QTextCursor c;
  QTextDocument local_28 [8];
  QTextDocument doc;
  QPainter *painter_local;
  QHexView *this_local;
  
  QTextDocument::QTextDocument(local_28,(QObject *)0x0);
  QTextDocument::setDocumentMargin(0.0);
  QTextDocument::setUndoRedoEnabled(SUB81(local_28,0));
  QWidget::font((QWidget *)this);
  QTextDocument::setDefaultFont((QFont *)local_28);
  QTextCursor::QTextCursor(local_40,local_28);
  drawHeader(this,local_40);
  drawDocument(this,local_40);
  QAbstractScrollArea::horizontalScrollBar();
  iVar1 = QAbstractSlider::value();
  QPainter::translate(painter,(double)-iVar1,0.0);
  QRectF::QRectF(&local_60);
  QTextDocument::drawContents((QPainter *)local_28,(QRectF *)painter);
  drawSeparators(this,painter);
  QTextCursor::~QTextCursor(local_40);
  QTextDocument::~QTextDocument(local_28);
  return;
}

Assistant:

void QHexView::paint(QPainter* painter) const {
    QTextDocument doc;
    doc.setDocumentMargin(0);
    doc.setUndoRedoEnabled(false);
    doc.setDefaultFont(this->font());

    QTextCursor c(&doc);

    this->drawHeader(c);
    this->drawDocument(c);

    painter->translate(-this->horizontalScrollBar()->value(), 0);
    doc.drawContents(painter);
    this->drawSeparators(painter);
}